

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Spc_Emu::start_track_(Spc_Emu *this,int track)

{
  blargg_err_t pcVar1;
  
  Fir_Resampler_::clear(&(this->resampler).super_Fir_Resampler_);
  SPC_Filter::clear(&this->filter);
  pcVar1 = Snes_Spc::load_spc(&this->apu,this->file_data,this->file_size);
  if (pcVar1 == (blargg_err_t)0x0) {
    (this->filter).gain = (int)((this->super_Music_Emu).gain_ * 256.0);
    Snes_Spc::clear_echo(&this->apu);
    pcVar1 = (blargg_err_t)0x0;
  }
  return pcVar1;
}

Assistant:

blargg_err_t Spc_Emu::start_track_( int track )
{
	RETURN_ERR( Music_Emu::start_track_( track ) );
	resampler.clear();
	filter.clear();
	RETURN_ERR( apu.load_spc( file_data, file_size ) );
	filter.set_gain( (int) (gain() * SPC_Filter::gain_unit) );
	apu.clear_echo();
	return 0;
}